

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O3

void XUtf8_measure_extents
               (Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int *xx,int *yy,int *ww,
               int *hh,char *string,int num_bytes)

{
  uint uVar1;
  XFontStruct **ppXVar2;
  uint ucs;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int fnt_dsc;
  int fnt_asc;
  int dir_ret;
  XCharStruct sizes;
  XChar2b buf [128];
  undefined2 local_1ba;
  int local_1b8;
  int local_1b4;
  unsigned_short local_1ae;
  int local_1ac;
  uint local_1a8 [5];
  undefined1 local_194 [4];
  short local_190;
  short local_18e;
  short local_18c;
  Display *local_188;
  GC local_180;
  ulong local_178;
  int local_170;
  uint local_16c;
  uchar *local_168;
  int *local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  long local_140;
  undefined2 local_138 [132];
  
  local_1a8[3] = 0;
  local_1a8[2] = 0;
  local_1a8[1] = 0;
  uVar1 = font_set->nb_font;
  if ((int)uVar1 < 1) {
    return;
  }
  local_160 = font_set->ranges;
  local_158 = font_set->encodings;
  ppXVar2 = font_set->fonts;
  uVar11 = 0;
  while (ppXVar2[uVar11] == (XFontStruct *)0x0) {
    uVar11 = uVar11 + 1;
    if (uVar1 == uVar11) {
      return;
    }
  }
  local_188 = display;
  local_180 = gc;
  local_150 = xx;
  local_148 = yy;
  if (num_bytes < 1) {
    iVar4 = 0x7fffffff;
    uVar6 = 0;
    local_1b8 = 0;
    iVar3 = 0;
    iVar9 = (int)uVar11;
  }
  else {
    iVar3 = 0;
    iVar4 = 0x7fffffff;
    local_1b8 = 0;
    uVar10 = uVar11 & 0xffffffff;
    uVar6 = 0;
    do {
      local_170 = (int)uVar10;
      lVar7 = (long)local_170;
      local_1b4 = iVar4;
      local_1ac = iVar3;
      local_1a8[4] = num_bytes;
      local_168 = (uchar *)string;
      local_140 = lVar7;
      if (0x78 < (int)uVar6) {
        XSetFont(local_188,local_180,ppXVar2[lVar7]->fid);
        XTextExtents16(ppXVar2[lVar7],local_138,uVar6,local_1a8 + 3,local_1a8 + 2,local_1a8 + 1,
                       local_194);
        local_1b8 = local_1b8 + local_190;
        iVar3 = (int)local_18e;
        if (local_1ac < local_18c + iVar3) {
          local_1ac = local_18c + iVar3;
        }
        if (SBORROW4(local_1b4,-iVar3) == local_1b4 + iVar3 < 0) {
          local_1b4 = -iVar3;
        }
        local_178 = 0;
        uVar6 = local_178;
      }
      local_178 = uVar6;
      local_16c = XFastConvertUtf8ToUcs(local_168,local_1a8[4],local_1a8);
      if ((int)local_16c < 2) {
        local_16c = 1;
      }
      local_1ae = XUtf8IsNonSpacing(local_1a8[0]);
      if (local_1ae != 0) {
        local_1a8[0] = (uint)local_1ae;
      }
      ucs = local_1a8[0];
      uVar10 = uVar11;
      if ((int)uVar11 < (int)uVar1) {
        do {
          if (ppXVar2[uVar10] != (XFontStruct *)0x0) {
            iVar3 = local_158[uVar10];
            iVar4 = ucs2fontmap((char *)&local_1ba,ucs,iVar3);
            if ((-1 < iVar4) &&
               ((iVar3 != 0 ||
                ((local_160[uVar10 * 2] <= (int)ucs && ((int)ucs <= local_160[uVar10 * 2 + 1]))))))
            goto LAB_001fcdd0;
          }
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
LAB_001fcdd5:
        ucs2fontmap((char *)&local_1ba,0x3f,local_158[uVar11]);
        uVar10 = uVar11 & 0xffffffff;
      }
      else {
        uVar10 = uVar11 & 0xffffffff;
LAB_001fcdd0:
        if ((uint)uVar10 == uVar1) goto LAB_001fcdd5;
      }
      lVar7 = local_140;
      iVar9 = (int)uVar10;
      if ((local_1ae == 0) && (local_170 == iVar9)) {
        local_138[(int)local_178] = local_1ba;
        uVar6 = (ulong)((int)local_178 + 1);
        iVar4 = local_1b4;
        iVar3 = local_1ac;
      }
      else {
        XSetFont(local_188,local_180,ppXVar2[local_140]->fid);
        XTextExtents16(ppXVar2[lVar7],local_138,local_178,local_1a8 + 3,local_1a8 + 2,local_1a8 + 1,
                       local_194);
        iVar5 = local_1b8 + local_190;
        iVar8 = (int)local_18e;
        iVar3 = local_18c + iVar8;
        if (local_18c + iVar8 <= local_1ac) {
          iVar3 = local_1ac;
        }
        iVar4 = -iVar8;
        if (SBORROW4(local_1b4,-iVar8) != local_1b4 + iVar8 < 0) {
          iVar4 = local_1b4;
        }
        local_138[0] = local_1ba;
        if (local_1ae == 0) {
          uVar6 = 1;
          local_1b8 = iVar5;
        }
        else {
          local_1b4 = iVar3;
          local_1b8 = XTextWidth16(ppXVar2[iVar9],local_138,1);
          uVar6 = 1;
          local_1b8 = iVar5 - local_1b8;
          iVar3 = local_1b4;
        }
      }
      string = (char *)(local_168 + local_16c);
      num_bytes = local_1a8[4] - local_16c;
    } while (num_bytes != 0 && (int)local_16c <= (int)local_1a8[4]);
  }
  XSetFont(local_188,local_180,ppXVar2[iVar9]->fid);
  XTextExtents16(ppXVar2[iVar9],local_138,uVar6,local_1a8 + 3,local_1a8 + 2,local_1a8 + 1,local_194)
  ;
  iVar5 = (int)local_18e;
  iVar9 = local_18c + iVar5;
  if (local_18c + iVar5 <= iVar3) {
    iVar9 = iVar3;
  }
  iVar3 = -iVar5;
  if (SBORROW4(iVar4,-iVar5) != iVar4 + iVar5 < 0) {
    iVar3 = iVar4;
  }
  *ww = local_190 + local_1b8;
  *hh = iVar9;
  *local_150 = 0;
  *local_148 = iVar3;
  return;
}

Assistant:

void
XUtf8_measure_extents(
        Display         	*display,
        Drawable        	d,
        XUtf8FontStruct  *font_set,
        GC              	gc,
        int             	*xx,     /* x-offset from origin */
        int             	*yy,     /* y-offset from origin */
        int             	*ww,     /* overall inked width  */
        int             	*hh,     /* maximum inked height */
        const char      	*string, /* text to measure */
        int             	num_bytes) {
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  int wd = 0; /* accumulates the width of the text */
  int ht = 0; /* used to find max height in text */
  int hs;     /* "height sum" of current text segment */
  int yt = 0x7FFFFFFF; /* used to find bounding rectangle delta-y */
  /* int res; */ /* result from calling XTextExtents16() - we should test this is OK! */
  /* FC: the man does not specify error codes for it, but X will generate X errors like BadGC or BadFont. */

  XCharStruct sizes;
  int dir_ret = 0;
  int fnt_asc = 0;
  int fnt_dsc = 0;

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      /* res = */ XTextExtents16(fonts[last_fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	wd -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
  /* recover the dimensions - should verify that res == 0 first! */
  wd += sizes.width; /* accumulate the width */
  hs = sizes.ascent + sizes.descent; /* total height */
  if(hs > ht) ht = hs; /* new height exceeds previous height */
  if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
  /* return values */
  *ww = wd; /* width of inked area rectangle */
  *hh = ht; /* max height of inked area rectangle */
  *xx = 0;  /* x-offset from origin to start of inked area - this is wrong! */
  *yy = yt; /* y-offset from origin to start of inked rectangle */
}